

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDualRHS.cpp
# Opt level: O0

void __thiscall HDualRHS::create_infeasList(HDualRHS *this,double columnDensity)

{
  double dVar1;
  int iVar2;
  int iVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  double *pdVar7;
  double *in_RDI;
  double in_XMM0_Qa;
  double *__last;
  int iRow_3;
  int i;
  int fullCount;
  int iRow_2;
  double cutMerit;
  double myMerit;
  int iPut;
  int iRow_1;
  double maxMerit;
  int icutoff;
  int iRow;
  double *dwork;
  int numRow;
  int *in_stack_ffffffffffffff40;
  value_type vVar8;
  value_type in_stack_ffffffffffffff48;
  int iVar9;
  char *in_stack_ffffffffffffff50;
  uint in_stack_ffffffffffffff58;
  uint uVar10;
  int in_stack_ffffffffffffff5c;
  int local_90;
  int local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  int local_60;
  int local_5c;
  double local_58;
  double local_50;
  double local_48;
  int local_3c;
  double local_38;
  double local_30;
  int local_28;
  undefined4 local_24;
  reference local_20;
  int local_14;
  double local_10;
  
  local_10 = in_XMM0_Qa;
  local_14 = HModel::getNumRow((HModel *)*in_RDI);
  local_20 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xf),0);
  std::vector<char,_std::allocator<char>_>::operator[]
            ((vector<char,_std::allocator<char>_> *)(in_RDI + 3),0);
  local_24 = 0;
  std::fill_n<char*,int,int>
            (in_stack_ffffffffffffff50,(int)((ulong)in_stack_ffffffffffffff48 >> 0x20),
             in_stack_ffffffffffffff40);
  *(undefined4 *)(in_RDI + 2) = 0;
  in_RDI[1] = 0.0;
  for (local_28 = 0; local_28 < local_14; local_28 = local_28 + 1) {
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 9),(long)local_28);
    if ((*pvVar4 != 0.0) || (NAN(*pvVar4))) {
      pvVar5 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)(in_RDI + 3),(long)local_28);
      *pvVar5 = '\x01';
      iVar9 = *(int *)(in_RDI + 2);
      *(int *)(in_RDI + 2) = iVar9 + 1;
      in_stack_ffffffffffffff5c = local_28;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 6),(long)iVar9);
      *pvVar6 = in_stack_ffffffffffffff5c;
    }
  }
  __last = (double *)(double)*(int *)(in_RDI + 2);
  local_30 = (double)local_14 * 0.01;
  local_38 = 500.0;
  pdVar7 = std::max<double>(&local_30,&local_38);
  uVar10 = in_stack_ffffffffffffff58 & 0xffffff;
  if (*pdVar7 <= (double)__last && (double)__last != *pdVar7) {
    uVar10 = CONCAT13(local_10 < 0.05,(int3)in_stack_ffffffffffffff58);
  }
  if ((char)(uVar10 >> 0x18) != '\0') {
    local_48 = (double)*(int *)(in_RDI + 2) * 0.001;
    local_50 = 500.0;
    pdVar7 = std::max<double>(&local_48,&local_50);
    local_3c = (int)*pdVar7;
    local_58 = 0.0;
    local_60 = 0;
    for (local_5c = 0; iVar9 = (int)((ulong)in_stack_ffffffffffffff48 >> 0x20), local_5c < local_14;
        local_5c = local_5c + 1) {
      pvVar5 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)(in_RDI + 3),(long)local_5c);
      if (*pvVar5 != '\0') {
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 9),(long)local_5c);
        in_stack_ffffffffffffff48 = *pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xc),(long)local_5c
                           );
        local_68 = in_stack_ffffffffffffff48 / *pvVar4;
        if (local_58 < local_68) {
          local_58 = local_68;
        }
        local_20[local_60] = -local_68;
        local_60 = local_60 + 1;
      }
    }
    std::nth_element<double*>(in_RDI,(double *)CONCAT44(in_stack_ffffffffffffff5c,uVar10),__last);
    local_70 = -local_20[local_3c];
    local_78 = local_58 * 0.99999;
    local_80 = local_70 * 1.00001;
    pdVar7 = std::min<double>(&local_78,&local_80);
    in_RDI[1] = *pdVar7;
    std::vector<char,_std::allocator<char>_>::operator[]
              ((vector<char,_std::allocator<char>_> *)(in_RDI + 3),0);
    std::fill_n<char*,int,int>((char *)__last,iVar9,in_stack_ffffffffffffff40);
    *(undefined4 *)(in_RDI + 2) = 0;
    for (local_88 = 0; local_88 < local_14; local_88 = local_88 + 1) {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 9),(long)local_88);
      vVar8 = *pvVar4;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xc),(long)local_88);
      if (*pvVar4 * in_RDI[1] <= vVar8) {
        iVar9 = *(int *)(in_RDI + 2);
        *(int *)(in_RDI + 2) = iVar9 + 1;
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 6),(long)iVar9);
        *pvVar6 = local_88;
        pvVar5 = std::vector<char,_std::allocator<char>_>::operator[]
                           ((vector<char,_std::allocator<char>_> *)(in_RDI + 3),(long)local_88);
        *pvVar5 = '\x01';
      }
    }
    if ((double)local_3c * 1.5 < (double)*(int *)(in_RDI + 2)) {
      iVar9 = *(int *)(in_RDI + 2);
      *(int *)(in_RDI + 2) = local_3c;
      for (local_90 = local_3c; local_90 < iVar9; local_90 = local_90 + 1) {
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 6),(long)local_90);
        iVar2 = *pvVar6;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 9),(long)iVar2);
        dVar1 = *pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xc),(long)iVar2);
        if (dVar1 <= *pvVar4 * local_70) {
          pvVar5 = std::vector<char,_std::allocator<char>_>::operator[]
                             ((vector<char,_std::allocator<char>_> *)(in_RDI + 3),(long)iVar2);
          *pvVar5 = '\0';
        }
        else {
          iVar3 = *(int *)(in_RDI + 2);
          *(int *)(in_RDI + 2) = iVar3 + 1;
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 6),(long)iVar3);
          *pvVar6 = iVar2;
        }
      }
    }
  }
  if ((double)local_14 * 0.2 < (double)*(int *)(in_RDI + 2)) {
    *(int *)(in_RDI + 2) = -local_14;
    in_RDI[1] = 0.0;
  }
  return;
}

Assistant:

void HDualRHS::create_infeasList(double columnDensity) {
    int numRow = workModel->getNumRow();
    double *dwork = &workEdWtFull[0];

// 1. Build the full list
    fill_n(&workMark[0], numRow, 0);
    workCount = 0;
    workCutoff = 0;
    for (int iRow = 0; iRow < numRow; iRow++) {
        if (workArray[iRow]) {
            workMark[iRow] = 1;
            workIndex[workCount++] = iRow;
        }
    }

// 2. See if it worth to try to go sparse
//    (Many candidates, really sparse RHS)
    if (workCount > max(numRow * 0.01, 500.0) && columnDensity < 0.05) {
        int icutoff = max(workCount * 0.001, 500.0);
        double maxMerit = 0;
        for (int iRow = 0, iPut = 0; iRow < numRow; iRow++)
            if (workMark[iRow]) {
                double myMerit = workArray[iRow] / workEdWt[iRow];
                if (maxMerit < myMerit)
                    maxMerit = myMerit;
                dwork[iPut++] = -myMerit;
            }
        nth_element(dwork, dwork + icutoff, dwork + workCount);
        double cutMerit = -dwork[icutoff];
        workCutoff = min(maxMerit * 0.99999, cutMerit * 1.00001);

        // Create again
        fill_n(&workMark[0], numRow, 0);
        workCount = 0;
        for (int iRow = 0; iRow < numRow; iRow++) {
            if (workArray[iRow] >= workEdWt[iRow] * workCutoff) {
                workIndex[workCount++] = iRow;
                workMark[iRow] = 1;
            }
        }

        // Reduce by drop smaller
        if (workCount > icutoff * 1.5) {
            // Firstly take up "icutoff" number of elements
            int fullCount = workCount;
            workCount = icutoff;
            for (int i = icutoff; i < fullCount; i++) {
                int iRow = workIndex[i];
                if (workArray[iRow] > workEdWt[iRow] * cutMerit) {
                    workIndex[workCount++] = iRow;
                } else {
                    workMark[iRow] = 0;
                }
            }
        }

//        cout
//                << "======================================================> WORK COUNT = "
//                << workCount << "\t icutoff = " << icutoff << "\t maxMerit = "
//                << maxMerit << "\t cutMerit = " << cutMerit << endl;
    }

// 3. If there is still too much candidates: disable them
    if (workCount > 0.2 * numRow) {
        workCount = -numRow;
        workCutoff = 0;
    }
}